

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O2

void __thiscall wasm::extract(wasm *this,PassRunner *runner,Module *module,Name name)

{
  pointer puVar1;
  size_type sVar2;
  Module *this_00;
  ostream *poVar3;
  Pass *pPVar4;
  PassRunner *pPVar5;
  PassRunner *pPVar6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar7;
  bool bVar8;
  Name name_00;
  Name value;
  Name name_01;
  undefined1 auStack_1f8 [8];
  PassRunner postRunner;
  string local_70;
  Module *local_50;
  Module *local_48;
  PassRunner *local_40;
  allocator<char> local_31;
  
  pPVar5 = name.super_IString.str._M_len;
  pPVar6 = pPVar5;
  local_40 = (PassRunner *)this;
  poVar3 = std::operator<<((ostream *)&std::cerr,"extracting ");
  name_00.super_IString.str._M_str = (char *)pPVar6;
  name_00.super_IString.str._M_len = (size_t)pPVar5;
  local_48 = module;
  poVar3 = operator<<((wasm *)poVar3,(ostream *)module,name_00);
  std::operator<<(poVar3,"\n");
  puVar1 = (runner->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = false;
  local_50 = (Module *)runner;
  for (puVar7 = (runner->passes).
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this_00 = local_50, puVar7 != puVar1;
      puVar7 = puVar7 + 1) {
    if (((puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->runner == pPVar5) {
      bVar8 = true;
    }
    else {
      Name::Name((Name *)auStack_1f8,"env");
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      (pPVar4->name)._M_string_length = (size_type)auStack_1f8;
      (pPVar4->name).field_2._M_allocated_capacity = (size_type)postRunner._vptr_PassRunner;
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      pPVar6 = pPVar4->runner;
      *(_func_int ***)((long)&(pPVar4->name).field_2 + 8) = pPVar4->_vptr_Pass;
      pPVar4[1]._vptr_Pass = (_func_int **)pPVar6;
      pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      sVar2 = pPVar4[1].name._M_string_length;
      if (pPVar4[1].name.field_2._M_allocated_capacity != sVar2) {
        pPVar4[1].name.field_2._M_allocated_capacity = sVar2;
        pPVar4 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      }
      pPVar4[2]._vptr_Pass = (_func_int **)0x0;
    }
  }
  if (bVar8) {
    std::
    vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ::clear(&local_50->exports);
    Module::updateMaps(this_00);
    value.super_IString.str._M_str = (char *)local_48;
    value.super_IString.str._M_len = (size_t)pPVar5;
    name_01.super_IString.str._M_str = (char *)local_48;
    name_01.super_IString.str._M_len = (size_t)auStack_1f8;
    Builder::makeExport(name_01,value,(ExternalKind)name.super_IString.str._M_len);
    Module::addExport(this_00,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              auStack_1f8);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_1f8);
    PassRunner::PassRunner((PassRunner *)auStack_1f8,local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"remove-unused-module-elements",&local_31);
    PassRunner::add((PassRunner *)auStack_1f8,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    PassRunner::run((PassRunner *)auStack_1f8);
    PassRunner::~PassRunner((PassRunner *)auStack_1f8);
    return;
  }
  Fatal::Fatal((Fatal *)auStack_1f8);
  Fatal::operator<<((Fatal *)auStack_1f8,(char (*) [40])"could not find the function to extract\n");
  Fatal::~Fatal((Fatal *)auStack_1f8);
}

Assistant:

static void extract(PassRunner* runner, Module* module, Name name) {
  std::cerr << "extracting " << name << "\n";
  bool found = false;
  for (auto& func : module->functions) {
    if (func->name != name) {
      // Turn it into an import.
      func->module = "env";
      func->base = func->name;
      func->vars.clear();
      func->body = nullptr;
    } else {
      found = true;
    }
  }
  if (!found) {
    Fatal() << "could not find the function to extract\n";
  }

  // Leave just one export, for the thing we want.
  module->exports.clear();
  module->updateMaps();
  module->addExport(Builder::makeExport(name, name, ExternalKind::Function));

  // Remove unneeded things.
  PassRunner postRunner(runner);
  postRunner.add("remove-unused-module-elements");
  postRunner.run();
}